

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_Tt6LastBit(word t)

{
  undefined4 local_1c;
  word wStack_18;
  int n;
  word t_local;
  
  local_1c = 0;
  if (t == 0) {
    t_local._4_4_ = -1;
  }
  else {
    wStack_18 = t;
    if ((t & 0xffffffff00000000) == 0) {
      local_1c = 0x20;
      wStack_18 = t << 0x20;
    }
    if ((wStack_18 & 0xffff000000000000) == 0) {
      local_1c = local_1c + 0x10;
      wStack_18 = wStack_18 << 0x10;
    }
    if ((wStack_18 & 0xff00000000000000) == 0) {
      local_1c = local_1c + 8;
      wStack_18 = wStack_18 << 8;
    }
    if ((wStack_18 & 0xf000000000000000) == 0) {
      local_1c = local_1c + 4;
      wStack_18 = wStack_18 << 4;
    }
    if ((wStack_18 & 0xc000000000000000) == 0) {
      local_1c = local_1c + 2;
      wStack_18 = wStack_18 << 2;
    }
    if ((wStack_18 & 0x8000000000000000) == 0) {
      local_1c = local_1c + 1;
    }
    t_local._4_4_ = 0x3f - local_1c;
  }
  return t_local._4_4_;
}

Assistant:

static inline int Abc_Tt6LastBit( word t )
{
    int n = 0;
    if ( t == 0 ) return -1;
    if ( (t & ABC_CONST(0xFFFFFFFF00000000)) == 0 ) { n += 32; t <<= 32; }
    if ( (t & ABC_CONST(0xFFFF000000000000)) == 0 ) { n += 16; t <<= 16; }
    if ( (t & ABC_CONST(0xFF00000000000000)) == 0 ) { n +=  8; t <<=  8; }
    if ( (t & ABC_CONST(0xF000000000000000)) == 0 ) { n +=  4; t <<=  4; }
    if ( (t & ABC_CONST(0xC000000000000000)) == 0 ) { n +=  2; t <<=  2; }
    if ( (t & ABC_CONST(0x8000000000000000)) == 0 ) { n++; }
    return 63-n;
}